

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_pcache * pcache1Create(int szPage,int szExtra,int bPurgeable)

{
  PCacheGlobal *p;
  PgHdr1 *pPVar1;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int sz;
  PCache1 *unaff_retaddr;
  PGroup *pGroup;
  PCache1 *pCache;
  sqlite3_pcache *local_18;
  
  local_18 = (sqlite3_pcache *)sqlite3MallocZero(0xaaaaaaaaaaaaaaaa);
  if (local_18 != (sqlite3_pcache *)0x0) {
    if (pcache1_g.separateCache == 0) {
      p = &pcache1_g;
    }
    else {
      p = (PCacheGlobal *)(local_18 + 0x58);
      *(undefined4 *)(local_18 + 0x68) = 10;
    }
    if ((p->grp).lru.isAnchor == 0) {
      (p->grp).lru.isAnchor = 1;
      pPVar1 = &(p->grp).lru;
      (p->grp).lru.pLruNext = pPVar1;
      (p->grp).lru.pLruPrev = pPVar1;
    }
    *(PCacheGlobal **)local_18 = p;
    *(int *)(local_18 + 0x10) = in_EDI;
    *(int *)(local_18 + 0x14) = in_ESI;
    *(int *)(local_18 + 0x18) = in_EDI + in_ESI + 0x38;
    *(uint *)(local_18 + 0x1c) = (uint)(in_EDX != 0);
    pcache1ResizeHash(unaff_retaddr);
    if (in_EDX == 0) {
      *(sqlite3_pcache **)(local_18 + 8) = local_18 + 0x30;
    }
    else {
      *(undefined4 *)(local_18 + 0x20) = 10;
      (p->grp).nMinPage = *(int *)(local_18 + 0x20) + (p->grp).nMinPage;
      (p->grp).mxPinned = ((p->grp).nMaxPage + 10) - (p->grp).nMinPage;
      *(uint **)(local_18 + 8) = &(p->grp).nPurgeable;
    }
    if (*(int *)(local_18 + 0x3c) == 0) {
      pcache1Destroy((sqlite3_pcache *)p);
      local_18 = (sqlite3_pcache *)0x0;
    }
  }
  return local_18;
}

Assistant:

static sqlite3_pcache *pcache1Create(int szPage, int szExtra, int bPurgeable){
  PCache1 *pCache;      /* The newly created page cache */
  PGroup *pGroup;       /* The group the new page cache will belong to */
  int sz;               /* Bytes of memory required to allocate the new cache */

  assert( (szPage & (szPage-1))==0 && szPage>=512 && szPage<=65536 );
  assert( szExtra < 300 );

  sz = sizeof(PCache1) + sizeof(PGroup)*pcache1.separateCache;
  pCache = (PCache1 *)sqlite3MallocZero(sz);
  if( pCache ){
    if( pcache1.separateCache ){
      pGroup = (PGroup*)&pCache[1];
      pGroup->mxPinned = 10;
    }else{
      pGroup = &pcache1.grp;
    }
    pcache1EnterMutex(pGroup);
    if( pGroup->lru.isAnchor==0 ){
      pGroup->lru.isAnchor = 1;
      pGroup->lru.pLruPrev = pGroup->lru.pLruNext = &pGroup->lru;
    }
    pCache->pGroup = pGroup;
    pCache->szPage = szPage;
    pCache->szExtra = szExtra;
    pCache->szAlloc = szPage + szExtra + ROUND8(sizeof(PgHdr1));
    pCache->bPurgeable = (bPurgeable ? 1 : 0);
    pcache1ResizeHash(pCache);
    if( bPurgeable ){
      pCache->nMin = 10;
      pGroup->nMinPage += pCache->nMin;
      pGroup->mxPinned = pGroup->nMaxPage + 10 - pGroup->nMinPage;
      pCache->pnPurgeable = &pGroup->nPurgeable;
    }else{
      pCache->pnPurgeable = &pCache->nPurgeableDummy;
    }
    pcache1LeaveMutex(pGroup);
    if( pCache->nHash==0 ){
      pcache1Destroy((sqlite3_pcache*)pCache);
      pCache = 0;
    }
  }
  return (sqlite3_pcache *)pCache;
}